

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_ldst_modrm(CPUX86State *env,DisasContext *s,int modrm,MemOp ot,int reg,int is_store)

{
  TCGContext *pTVar1;
  TCGv_i64 pTVar2;
  TCGArg TVar3;
  TCGTemp *pTVar4;
  TCGv_i64 pTVar5;
  int iVar6;
  ulong uVar7;
  
  if ((~modrm & 0xc0U) == 0) {
    uVar7 = (long)s->rex_b | (ulong)(modrm & 7);
    iVar6 = (int)uVar7;
    if (is_store != 0) {
      if (reg != 0x10) {
        pTVar5 = s->T0;
        pTVar1 = s->uc->tcg_ctx;
        if ((reg - 8U < 0xfffffffc || ot != MO_8) || (s->x86_64_hregs != false)) {
          if (pTVar1->cpu_regs[reg] != pTVar5) {
            tcg_gen_op2_x86_64(pTVar1,INDEX_op_mov_i64,(TCGArg)(pTVar5 + (long)pTVar1),
                               (TCGArg)(pTVar1->cpu_regs[reg] + (long)pTVar1));
          }
        }
        else {
          tcg_gen_extract_i64_x86_64(pTVar1,pTVar5,pTVar1->cpu_regs[reg - 4],8,8);
        }
      }
      pTVar5 = s->T0;
      reg = iVar6;
      goto LAB_005339b6;
    }
    pTVar5 = s->T0;
    pTVar1 = s->uc->tcg_ctx;
    if (((ot == MO_8) && (0xfffffffb < iVar6 - 8U)) && (s->x86_64_hregs == false)) {
      tcg_gen_extract_i64_x86_64(pTVar1,pTVar5,pTVar1->cpu_regs[iVar6 - 4],8,8);
    }
    else if (pTVar1->cpu_regs[uVar7] != pTVar5) {
      tcg_gen_op2_x86_64(pTVar1,INDEX_op_mov_i64,(TCGArg)(pTVar5 + (long)pTVar1),
                         (TCGArg)(pTVar1->cpu_regs[uVar7] + (long)pTVar1));
    }
  }
  else {
    gen_lea_modrm(env,s,modrm);
    if (is_store != 0) {
      if (reg != 0x10) {
        pTVar5 = s->T0;
        pTVar1 = s->uc->tcg_ctx;
        if ((reg - 8U < 0xfffffffc || ot != MO_8) || (s->x86_64_hregs != false)) {
          if (pTVar1->cpu_regs[reg] != pTVar5) {
            tcg_gen_op2_x86_64(pTVar1,INDEX_op_mov_i64,(TCGArg)(pTVar5 + (long)pTVar1),
                               (TCGArg)(pTVar1->cpu_regs[reg] + (long)pTVar1));
          }
        }
        else {
          tcg_gen_extract_i64_x86_64(pTVar1,pTVar5,pTVar1->cpu_regs[reg - 4],8,8);
        }
      }
      pTVar5 = s->A0;
      pTVar2 = s->T0;
      pTVar1 = s->uc->tcg_ctx;
      if (s->uc->hook[0xb].head != (list_item *)0x0) {
        TVar3 = s->prev_pc;
        pTVar4 = tcg_temp_new_internal_x86_64(pTVar1,TCG_TYPE_I64,false);
        tcg_gen_op2_x86_64(pTVar1,INDEX_op_movi_i64,(TCGArg)pTVar4,TVar3);
        tcg_gen_op3_x86_64(pTVar1,INDEX_op_st_i64,(TCGArg)pTVar4,
                           (TCGArg)(pTVar1->cpu_env + (long)pTVar1),0x80);
        tcg_temp_free_internal_x86_64(pTVar1,pTVar4);
      }
      tcg_gen_qemu_st_i64_x86_64(pTVar1,pTVar2,pTVar5,(long)s->mem_index,ot);
      return;
    }
    pTVar5 = s->A0;
    pTVar2 = s->T0;
    pTVar1 = s->uc->tcg_ctx;
    if (s->uc->hook[10].head != (list_item *)0x0) {
      TVar3 = s->prev_pc;
      pTVar4 = tcg_temp_new_internal_x86_64(pTVar1,TCG_TYPE_I64,false);
      tcg_gen_op2_x86_64(pTVar1,INDEX_op_movi_i64,(TCGArg)pTVar4,TVar3);
      tcg_gen_op3_x86_64(pTVar1,INDEX_op_st_i64,(TCGArg)pTVar4,
                         (TCGArg)(pTVar1->cpu_env + (long)pTVar1),0x80);
      tcg_temp_free_internal_x86_64(pTVar1,pTVar4);
    }
    tcg_gen_qemu_ld_i64_x86_64(pTVar1,pTVar2,pTVar5,(long)s->mem_index,ot);
  }
  if (reg == 0x10) {
    return;
  }
  pTVar5 = s->T0;
LAB_005339b6:
  gen_op_mov_reg_v(s,ot,reg,pTVar5);
  return;
}

Assistant:

static void gen_ldst_modrm(CPUX86State *env, DisasContext *s, int modrm,
                           MemOp ot, int reg, int is_store)
{
    int mod, rm;

    mod = (modrm >> 6) & 3;
    rm = (modrm & 7) | REX_B(s);
    if (mod == 3) {
        if (is_store) {
            if (reg != OR_TMP0)
                gen_op_mov_v_reg(s, ot, s->T0, reg);
            gen_op_mov_reg_v(s, ot, rm, s->T0);
        } else {
            gen_op_mov_v_reg(s, ot, s->T0, rm);
            if (reg != OR_TMP0)
                gen_op_mov_reg_v(s, ot, reg, s->T0);
        }
    } else {
        gen_lea_modrm(env, s, modrm);
        if (is_store) {
            if (reg != OR_TMP0)
                gen_op_mov_v_reg(s, ot, s->T0, reg);
            gen_op_st_v(s, ot, s->T0, s->A0);
        } else {
            gen_op_ld_v(s, ot, s->T0, s->A0);
            if (reg != OR_TMP0)
                gen_op_mov_reg_v(s, ot, reg, s->T0);
        }
    }
}